

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_image *
rf_gen_image_color_ez(rf_image *__return_storage_ptr__,int width,int height,rf_color color)

{
  rf_gen_image_color(__return_storage_ptr__,width,height,color,
                     (rf_allocator)(ZEXT816(0x11c8c8) << 0x40));
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_gen_image_color_ez(int width, int height, rf_color color) { return rf_gen_image_color(width, height, color, RF_DEFAULT_ALLOCATOR); }